

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

word * __thiscall capnp::_::SegmentBuilder::allocate(SegmentBuilder *this,SegmentWordCount amount)

{
  word *a;
  word *b;
  ptrdiff_t pVar1;
  word *result;
  SegmentWordCount amount_local;
  SegmentBuilder *this_local;
  
  a = this->pos;
  b = kj::ArrayPtr<const_capnp::word>::end(&(this->super_SegmentReader).ptr);
  pVar1 = intervalLength<capnp::word>(a,b,0x1fffffff);
  if (pVar1 < (long)(ulong)amount) {
    this_local = (SegmentBuilder *)0x0;
  }
  else {
    this_local = (SegmentBuilder *)this->pos;
    this->pos = this->pos + amount;
  }
  return (word *)this_local;
}

Assistant:

inline word* SegmentBuilder::allocate(SegmentWordCount amount) {
  if (intervalLength(pos, ptr.end(), MAX_SEGMENT_WORDS) < amount) {
    // Not enough space in the segment for this allocation.
    return nullptr;
  } else {
    // Success.
    word* result = pos;
    pos = pos + amount;
    return result;
  }
}